

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int xmlListAppend(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  int iVar2;
  _xmlLink *p_Var3;
  int iVar4;
  xmlLinkPtr pxVar5;
  
  iVar4 = 1;
  if (l != (xmlListPtr)0x0) {
    pxVar5 = l->sentinel;
    do {
      pxVar5 = pxVar5->prev;
      if (pxVar5 == l->sentinel) break;
      iVar2 = (*l->linkCompare)(pxVar5->data,data);
    } while (0 < iVar2);
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var3 != (_xmlLink *)0x0) {
      p_Var3->data = data;
      p_Var1 = pxVar5->next;
      p_Var3->next = p_Var1;
      p_Var1->prev = p_Var3;
      pxVar5->next = p_Var3;
      p_Var3->prev = pxVar5;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int xmlListAppend(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListHigherSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL)
        return (1);
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}